

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

ssize_t archive_read_data(archive *_a,void *buff,size_t s)

{
  long lVar1;
  long lVar2;
  size_t *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  int r;
  size_t len;
  size_t bytes_read;
  void *read_buf;
  char *dest;
  archive_read *a;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  size_t *in_stack_ffffffffffffffb8;
  void **buff_00;
  archive *_a_00;
  char *local_30;
  size_t *local_20;
  
  buff_00 = (void **)0x0;
  local_30 = in_RSI;
  local_20 = in_RDX;
  do {
    if (local_20 == (size_t *)0x0) {
      *(undefined1 *)&in_RDI[1].error_string.s = 0;
      in_RDI[1].error_string.length = 0;
      return (ssize_t)buff_00;
    }
    if (in_RDI[1].error == (char *)0x0) {
      _a_00 = *(archive **)&in_RDI[1].compression_code;
      *(undefined1 *)&in_RDI[1].error_string.s = 1;
      in_RDI[1].error_string.length = (size_t)local_20;
      in_stack_ffffffffffffffb4 =
           _archive_read_data_block
                     (_a_00,buff_00,in_stack_ffffffffffffffb8,
                      (int64_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      *(archive **)&in_RDI[1].compression_code = _a_00;
      if (in_stack_ffffffffffffffb4 == 1) {
        return (ssize_t)buff_00;
      }
      if (in_stack_ffffffffffffffb4 < 0) {
        return (long)in_stack_ffffffffffffffb4;
      }
    }
    lVar1._0_4_ = in_RDI[1].file_count;
    lVar1._4_4_ = in_RDI[1].archive_error_number;
    if ((long)in_RDI[1].compression_name < lVar1) {
      archive_set_error(in_RDI,0x54,"Encountered out-of-order sparse blocks");
      return -10;
    }
    in_stack_ffffffffffffffb8 = local_20;
    if ((long)in_RDI[1].compression_name <= (long)(*(long *)&in_RDI[1].file_count + (long)local_20))
    {
      lVar2._0_4_ = in_RDI[1].file_count;
      lVar2._4_4_ = in_RDI[1].archive_error_number;
      if (lVar2 < (long)in_RDI[1].compression_name) {
        in_stack_ffffffffffffffb8 =
             (size_t *)(in_RDI[1].compression_name + -*(long *)&in_RDI[1].file_count);
      }
      else {
        in_stack_ffffffffffffffb8 = (size_t *)0x0;
      }
    }
    memset(local_30,0,(size_t)in_stack_ffffffffffffffb8);
    local_20 = (size_t *)((long)local_20 - (long)in_stack_ffffffffffffffb8);
    *(char **)&in_RDI[1].file_count =
         (char *)((long)in_stack_ffffffffffffffb8 + *(long *)&in_RDI[1].file_count);
    local_30 = (char *)((long)in_stack_ffffffffffffffb8 + (long)local_30);
    buff_00 = (void **)((long)in_stack_ffffffffffffffb8 + (long)buff_00);
    if (local_20 != (size_t *)0x0) {
      in_stack_ffffffffffffffb8 = (size_t *)in_RDI[1].error;
      if (local_20 < in_RDI[1].error) {
        in_stack_ffffffffffffffb8 = local_20;
      }
      memcpy(local_30,*(void **)&in_RDI[1].compression_code,(size_t)in_stack_ffffffffffffffb8);
      local_20 = (size_t *)((long)local_20 - (long)in_stack_ffffffffffffffb8);
      *(char **)&in_RDI[1].compression_code =
           (char *)((long)in_stack_ffffffffffffffb8 + *(long *)&in_RDI[1].compression_code);
      in_RDI[1].error = in_RDI[1].error + -(long)in_stack_ffffffffffffffb8;
      *(char **)&in_RDI[1].file_count =
           (char *)((long)in_stack_ffffffffffffffb8 + *(long *)&in_RDI[1].file_count);
      in_RDI[1].compression_name =
           (char *)((long)in_stack_ffffffffffffffb8 + (long)in_RDI[1].compression_name);
      local_30 = (char *)((long)in_stack_ffffffffffffffb8 + (long)local_30);
      buff_00 = (void **)((long)in_stack_ffffffffffffffb8 + (long)buff_00);
    }
  } while( true );
}

Assistant:

ssize_t
archive_read_data(struct archive *_a, void *buff, size_t s)
{
	struct archive_read *a = (struct archive_read *)_a;
	char	*dest;
	const void *read_buf;
	size_t	 bytes_read;
	size_t	 len;
	int	 r;

	bytes_read = 0;
	dest = (char *)buff;

	while (s > 0) {
		if (a->read_data_remaining == 0) {
			read_buf = a->read_data_block;
			a->read_data_is_posix_read = 1;
			a->read_data_requested = s;
			r = _archive_read_data_block(&a->archive, &read_buf,
			    &a->read_data_remaining, &a->read_data_offset);
			a->read_data_block = read_buf;
			if (r == ARCHIVE_EOF)
				return (bytes_read);
			/*
			 * Error codes are all negative, so the status
			 * return here cannot be confused with a valid
			 * byte count.  (ARCHIVE_OK is zero.)
			 */
			if (r < ARCHIVE_OK)
				return (r);
		}

		if (a->read_data_offset < a->read_data_output_offset) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered out-of-order sparse blocks");
			return (ARCHIVE_RETRY);
		}

		/* Compute the amount of zero padding needed. */
		if (a->read_data_output_offset + (int64_t)s <
		    a->read_data_offset) {
			len = s;
		} else if (a->read_data_output_offset <
		    a->read_data_offset) {
			len = (size_t)(a->read_data_offset -
			    a->read_data_output_offset);
		} else
			len = 0;

		/* Add zeroes. */
		memset(dest, 0, len);
		s -= len;
		a->read_data_output_offset += len;
		dest += len;
		bytes_read += len;

		/* Copy data if there is any space left. */
		if (s > 0) {
			len = a->read_data_remaining;
			if (len > s)
				len = s;
			memcpy(dest, a->read_data_block, len);
			s -= len;
			a->read_data_block += len;
			a->read_data_remaining -= len;
			a->read_data_output_offset += len;
			a->read_data_offset += len;
			dest += len;
			bytes_read += len;
		}
	}
	a->read_data_is_posix_read = 0;
	a->read_data_requested = 0;
	return (bytes_read);
}